

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall kj::_::EagerPromiseNode<bool>::destroy(EagerPromiseNode<bool> *this)

{
  EagerPromiseNode<bool> *this_local;
  
  freePromise<kj::_::EagerPromiseNode<bool>>(this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }